

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall
pugi::xml_node::attribute(xml_node *this,char_t *name_,xml_attribute *hint_)

{
  xml_attribute_struct *attr;
  bool bVar1;
  bool local_51;
  bool local_41;
  xml_attribute_struct *local_40;
  xml_attribute_struct *j;
  xml_attribute_struct *i;
  xml_attribute_struct *hint;
  xml_attribute *hint__local;
  char_t *name__local;
  xml_node *this_local;
  
  attr = hint_->_attr;
  local_41 = true;
  if (attr != (xml_attribute_struct *)0x0) {
    local_51 = false;
    if (this->_root != (xml_node_struct *)0x0) {
      local_51 = impl::anon_unknown_0::is_attribute_of(attr,this->_root);
    }
    local_41 = local_51;
  }
  if (local_41 != false) {
    j = attr;
    if (this->_root == (xml_node_struct *)0x0) {
      xml_attribute::xml_attribute((xml_attribute *)&this_local);
    }
    else {
      for (; j != (xml_attribute_struct *)0x0; j = j->next_attribute) {
        if ((j->name != (char_t *)0x0) &&
           (bVar1 = impl::anon_unknown_0::strequal(name_,j->name), bVar1)) {
          hint_->_attr = j->next_attribute;
          xml_attribute::xml_attribute((xml_attribute *)&this_local,j);
          return (xml_attribute)(xml_attribute_struct *)this_local;
        }
      }
      for (local_40 = this->_root->first_attribute;
          local_40 != (xml_attribute_struct *)0x0 && local_40 != attr;
          local_40 = local_40->next_attribute) {
        if ((local_40->name != (char_t *)0x0) &&
           (bVar1 = impl::anon_unknown_0::strequal(name_,local_40->name), bVar1)) {
          hint_->_attr = local_40->next_attribute;
          xml_attribute::xml_attribute((xml_attribute *)&this_local,local_40);
          return (xml_attribute)(xml_attribute_struct *)this_local;
        }
      }
      xml_attribute::xml_attribute((xml_attribute *)&this_local);
    }
    return (xml_attribute)(xml_attribute_struct *)this_local;
  }
  __assert_fail("!hint || (_root && impl::is_attribute_of(hint, _root))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                ,0x15ac,
                "xml_attribute pugi::xml_node::attribute(const char_t *, xml_attribute &) const");
}

Assistant:

PUGI__FN xml_attribute xml_node::attribute(const char_t* name_, xml_attribute& hint_) const
	{
		xml_attribute_struct* hint = hint_._attr;

		// if hint is not an attribute of node, behavior is not defined
		assert(!hint || (_root && impl::is_attribute_of(hint, _root)));

		if (!_root) return xml_attribute();

		// optimistically search from hint up until the end
		for (xml_attribute_struct* i = hint; i; i = i->next_attribute)
			if (i->name && impl::strequal(name_, i->name))
			{
				// update hint to maximize efficiency of searching for consecutive attributes
				hint_._attr = i->next_attribute;

				return xml_attribute(i);
			}

		// wrap around and search from the first attribute until the hint
		// 'j' null pointer check is technically redundant, but it prevents a crash in case the assertion above fails
		for (xml_attribute_struct* j = _root->first_attribute; j && j != hint; j = j->next_attribute)
			if (j->name && impl::strequal(name_, j->name))
			{
				// update hint to maximize efficiency of searching for consecutive attributes
				hint_._attr = j->next_attribute;

				return xml_attribute(j);
			}

		return xml_attribute();
	}